

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali::write_report_for_query(cali_id_t chn_id,char *query,int flush_opts,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  CalQLParser parser;
  OutputStream stream;
  QueryProcessor queryP;
  Channel channel;
  Caliper c;
  QuerySpec spec;
  CalQLParser CStack_2b8;
  string local_2b0;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  SnapshotFlushFn local_270;
  Caliper local_250;
  undefined1 local_230 [520];
  
  Caliper::Caliper(&local_250);
  Caliper::get_channel((Caliper *)local_280,(cali_id_t)&local_250);
  if (((GlobalData *)local_280._8_8_ == (GlobalData *)0x0) ||
     (*(_Atomic_word *)(local_280._8_8_ + 8) < 1)) {
    std::ofstream::ofstream(local_230);
    local_230._512_4_ = CALI_TYPE_INV;
    poVar2 = Log::stream((Log *)local_230);
    poVar2 = std::operator<<(poVar2,"write_report_for_query(): invalid channel id ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ofstream::~ofstream(local_230);
  }
  else {
    CalQLParser::CalQLParser(&CStack_2b8,query);
    bVar1 = CalQLParser::error(&CStack_2b8);
    if (bVar1) {
      std::ofstream::ofstream(local_230);
      local_230._512_4_ = CALI_TYPE_INV;
      poVar2 = Log::stream((Log *)local_230);
      poVar2 = std::operator<<(poVar2,"write_report_for_query(): query parse error: ");
      CalQLParser::error_msg_abi_cxx11_(&local_2b0,&CStack_2b8);
      poVar2 = std::operator<<(poVar2,(string *)&local_2b0);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::ofstream::~ofstream(local_230);
    }
    else {
      CalQLParser::spec((QuerySpec *)local_230,&CStack_2b8);
      OutputStream::OutputStream((OutputStream *)&local_2b0);
      OutputStream::set_stream((OutputStream *)&local_2b0,os);
      QueryProcessor::QueryProcessor
                ((QueryProcessor *)local_290,(QuerySpec *)local_230,(OutputStream *)&local_2b0);
      local_270.super__Function_base._M_functor._8_8_ = (Node *)0x0;
      local_270._M_invoker =
           std::
           _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/cali.cpp:822:45)>
           ::_M_invoke;
      local_270.super__Function_base._M_manager =
           std::
           _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/cali.cpp:822:45)>
           ::_M_manager;
      local_270.super__Function_base._M_functor._M_unused._M_object = (ThreadData *)local_290;
      Caliper::flush(&local_250,(ChannelBody *)local_280._0_8_,(SnapshotView)ZEXT816(0),&local_270);
      std::_Function_base::~_Function_base(&local_270.super__Function_base);
      QueryProcessor::flush
                ((QueryProcessor *)local_290,&local_250.super_CaliperMetadataAccessInterface);
      QueryProcessor::~QueryProcessor((QueryProcessor *)local_290);
      OutputStream::~OutputStream((OutputStream *)&local_2b0);
      QuerySpec::~QuerySpec((QuerySpec *)local_230);
    }
    CalQLParser::~CalQLParser(&CStack_2b8);
  }
  Channel::~Channel((Channel *)local_280);
  return;
}

Assistant:

void write_report_for_query(cali_id_t chn_id, const char* query, int flush_opts, std::ostream& os)
{
    Caliper c;
    Channel channel = c.get_channel(chn_id);

    if (!channel) {
        Log(0).stream() << "write_report_for_query(): invalid channel id " << chn_id << std::endl;

        return;
    }

    CalQLParser parser(query);

    if (parser.error()) {
        Log(0).stream() << "write_report_for_query(): query parse error: " << parser.error_msg() << std::endl;

        return;
    }

    QuerySpec    spec(parser.spec());
    OutputStream stream;

    stream.set_stream(&os);

    QueryProcessor queryP(spec, stream);

    c.flush(channel.body(), SnapshotView(), [&queryP](CaliperMetadataAccessInterface& db, const std::vector<Entry>& rec) {
        queryP.process_record(db, rec);
    });

    queryP.flush(c);
}